

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * sx_replace(char *dest,int dest_sz,char *src,char *find,char *replace)

{
  char cVar1;
  code *pcVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  int var__a;
  int iVar9;
  int iVar10;
  int var__b;
  
  if (dest != src) {
    cVar1 = *find;
    iVar4 = sx_strlen(find);
    iVar5 = sx_strlen(replace);
    iVar6 = sx_strlen(src);
    iVar10 = 0;
    pcVar8 = src;
    while( true ) {
      cVar3 = *pcVar8;
      if ((cVar3 == '\0') || (iVar9 = (dest_sz + -1) - iVar10, iVar9 == 0 || dest_sz + -1 < iVar10))
      break;
      if (((cVar1 == cVar3) &&
          (iVar6 = iVar6 + ((int)src - (int)pcVar8), cVar3 = cVar1, iVar4 <= iVar6)) &&
         (iVar7 = bcmp(pcVar8,find,(long)iVar4), iVar7 == 0)) {
        pcVar8 = pcVar8 + iVar4;
        if (iVar5 <= iVar9) {
          iVar9 = iVar5;
        }
        memcpy(dest + iVar10,replace,(long)iVar9);
        iVar10 = iVar9 + iVar10;
      }
      else {
        dest[iVar10] = cVar3;
        iVar10 = iVar10 + 1;
      }
      pcVar8 = pcVar8 + 1;
    }
    dest[iVar10] = '\0';
    return dest;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                    0x23c,"dest != src");
  pcVar2 = (code *)swi(3);
  pcVar8 = (char *)(*pcVar2)();
  return pcVar8;
}

Assistant:

char* sx_replace(char* dest, int dest_sz, const char* src, const char* find, const char* replace)
{
    sx_assert(dest != src);

    char f = find[0];
    int flen = sx_strlen(find);
    int rlen = sx_strlen(replace);
    int srclen = sx_strlen(src);
    int offset = 0;
    int dest_max = dest_sz - 1;
    const char* start = src;

    while (*src && offset < dest_max) {
        // Found first character, check for rest
        if (f != *src) {
            dest[offset++] = *src;
        } else {
            srclen -= (int)(intptr_t)(src - start);

            if (srclen >= flen && sx_memcmp(src, find, flen) == 0) {
                src += flen;
                int l = sx_min(dest_max - offset, rlen);
                sx_memcpy(dest + offset, replace, l);
                offset += l;
            } else {
                dest[offset++] = *src;
            }
        }

        ++src;
    }

    dest[offset] = '\0';
    return dest;
}